

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomButtonGroup::read(DomButtonGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator o;
  size_t sVar4;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomProperty *v_1;
  DomProperty *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffe08;
  DomProperty *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  byte in_stack_fffffffffffffe1f;
  DomProperty *in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  parameter_type in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  byte in_stack_fffffffffffffe3f;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe10);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe10);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1aa4c0);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (size_t)in_stack_fffffffffffffe20);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffe20,
               (QString *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    in_stack_fffffffffffffe3f =
         ::operator==((QStringView *)in_stack_fffffffffffffe10,
                      (QStringView *)in_stack_fffffffffffffe08);
    QString::~QString((QString *)0x1aa524);
    if ((in_stack_fffffffffffffe3f & 1) == 0) {
      in_stack_fffffffffffffe30 = (parameter_type)CONCAT44(in_register_00000034,__fd);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 (size_t)in_stack_fffffffffffffe10);
      ::operator+((QLatin1String *)in_stack_fffffffffffffe10,
                  (QStringView *)in_stack_fffffffffffffe08);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffe08);
      QXmlStreamReader::raiseError(&in_stack_fffffffffffffe30->m_attr_name);
      QString::~QString((QString *)0x1aa5fa);
    }
    else {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1aa538);
      QStringView::toString((QStringView *)in_stack_fffffffffffffe10);
      setAttributeName((DomButtonGroup *)in_stack_fffffffffffffe10,
                       &in_stack_fffffffffffffe08->m_attr_name);
      QString::~QString((QString *)0x1aa57c);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1aa618);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001aa8ab;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT44(iVar2,in_stack_fffffffffffffe28),
                 (size_t)in_stack_fffffffffffffe20);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffe20,
                 (QString *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
      sVar4 = 0;
      other.m_data._0_7_ = in_stack_fffffffffffffe38;
      other.m_size = (qsizetype)in_stack_fffffffffffffe30;
      other.m_data._7_1_ = in_stack_fffffffffffffe3f;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffe08,other,CaseInsensitive);
      in_stack_fffffffffffffe28 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffe28) ^ 0xff000000;
      QString::~QString((QString *)0x1aa6ea);
      if ((in_stack_fffffffffffffe28 & 0x1000000) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT44(iVar2,in_stack_fffffffffffffe28),
                   (size_t)in_stack_fffffffffffffe20);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffe20,
                   (QString *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        sVar4 = 0;
        other_00.m_data._0_7_ = in_stack_fffffffffffffe38;
        other_00.m_size = (qsizetype)in_stack_fffffffffffffe30;
        other_00.m_data._7_1_ = in_stack_fffffffffffffe3f;
        iVar2 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffe08,other_00,CaseInsensitive);
        in_stack_fffffffffffffe1f = iVar2 != 0 ^ 0xff;
        QString::~QString((QString *)0x1aa7b3);
        if ((in_stack_fffffffffffffe1f & 1) == 0) {
          in_stack_fffffffffffffe08 = (parameter_type)CONCAT44(in_register_00000034,__fd);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                     (size_t)in_stack_fffffffffffffe10);
          ::operator+((QLatin1String *)in_stack_fffffffffffffe10,
                      (QStringView *)in_stack_fffffffffffffe08);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffe08
                    );
          QXmlStreamReader::raiseError(&in_stack_fffffffffffffe08->m_attr_name);
          QString::~QString((QString *)0x1aa890);
        }
        else {
          in_stack_fffffffffffffe10 = (DomProperty *)operator_new(0x178);
          memset(in_stack_fffffffffffffe10,0,0x178);
          DomProperty::DomProperty(in_stack_fffffffffffffe10);
          DomProperty::read(in_stack_fffffffffffffe10,__fd,__buf_01,sVar4);
          QList<DomProperty_*>::append((QList<DomProperty_*> *)0x1aa811,in_stack_fffffffffffffe08);
        }
      }
      else {
        in_stack_fffffffffffffe20 = (DomProperty *)operator_new(0x178);
        memset(in_stack_fffffffffffffe20,0,0x178);
        DomProperty::DomProperty(in_stack_fffffffffffffe10);
        DomProperty::read(in_stack_fffffffffffffe20,__fd,__buf_00,sVar4);
        QList<DomProperty_*>::append((QList<DomProperty_*> *)0x1aa748,in_stack_fffffffffffffe08);
      }
    }
  } while (iVar2 != 5);
LAB_001aa8ab:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1aa8b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomButtonGroup::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}